

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O2

astcenc_error astcenc_get_block_info(astcenc_context *ctxo,uint8_t *data,astcenc_block_info *info)

{
  byte bVar1;
  ushort uVar2;
  block_size_descriptor *pbVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  uint uVar17;
  block_mode *pbVar18;
  long lVar19;
  uint i_1;
  bool bVar20;
  float (*paafVar21) [2] [4];
  uint i;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  bool a_hdr;
  symbolic_compressed_block scb;
  int weight_plane1 [216];
  int weight_plane2 [216];
  bool local_891;
  block_mode *local_890;
  decimation_info *local_888;
  partition_info *local_880;
  block_size_descriptor *local_878;
  undefined4 local_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 local_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined4 local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  undefined4 local_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined4 local_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 local_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  undefined4 local_7d0;
  undefined4 uStack_7cc;
  undefined4 uStack_7c8;
  undefined4 uStack_7c4;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined2 local_7b0;
  undefined2 uStack_7ae;
  undefined2 uStack_7ac;
  undefined2 uStack_7aa;
  undefined2 uStack_7a8;
  undefined2 uStack_7a6;
  undefined2 uStack_7a4;
  undefined2 uStack_7a2;
  symbolic_compressed_block local_7a0;
  vint4 local_720;
  vint4 local_710 [53];
  bool local_3c0 [912];
  
  physical_to_symbolic((ctxo->context).bsd,data,&local_7a0);
  pbVar3 = (ctxo->context).bsd;
  memset(info,0,0x860);
  info->profile = (ctxo->context).config.profile;
  uVar17 = (ctxo->context).config.block_y;
  info->block_x = (ctxo->context).config.block_x;
  info->block_y = uVar17;
  info->block_z = (ctxo->context).config.block_z;
  info->texel_count = (uint)pbVar3->texel_count;
  info->is_error_block = local_7a0.block_type == 0;
  if ((local_7a0.block_type != 0) &&
     (info->is_constant_block = local_7a0.block_type < 3, local_7a0.block_type >= 3)) {
    local_880 = block_size_descriptor::get_partition_info
                          (pbVar3,(uint)local_7a0.partition_count,(uint)local_7a0.partition_index);
    pbVar18 = block_size_descriptor::get_block_mode(pbVar3,(uint)local_7a0.block_mode);
    bVar1 = local_7a0.partition_count;
    bVar16 = pbVar18->decimation_mode;
    local_888 = pbVar3->decimation_tables + bVar16;
    uVar2._0_1_ = pbVar3->decimation_tables[bVar16].weight_x;
    uVar2._1_1_ = pbVar3->decimation_tables[bVar16].weight_y;
    auVar5 = vpmovzxbd_avx(ZEXT216(uVar2));
    info->weight_x = (int)auVar5._0_8_;
    info->weight_y = (int)((ulong)auVar5._0_8_ >> 0x20);
    info->weight_z = (uint)pbVar3->decimation_tables[bVar16].weight_z;
    info->is_dual_plane_block = (bool)(pbVar18->field_0x5 & 1);
    info->partition_count = (uint)local_7a0.partition_count;
    info->partition_index = (uint)local_7a0.partition_index;
    info->dual_plane_component = (int)local_7a0.plane2_component;
    local_878 = pbVar3;
    uVar17 = get_quant_level(local_7a0.quant_mode);
    info->color_level_count = uVar17;
    local_890 = pbVar18;
    uVar17 = get_quant_level((uint)pbVar18->quant_mode);
    info->weight_level_count = uVar17;
    paafVar21 = info->color_endpoints;
    local_7b0 = 5;
    uStack_7ae = 5;
    uStack_7ac = 5;
    uStack_7aa = 5;
    uStack_7a8 = 5;
    uStack_7a6 = 5;
    uStack_7a4 = 5;
    uStack_7a2 = 5;
    local_7c0 = 0xfffff800;
    uStack_7bc = 0xfffff800;
    uStack_7b8 = 0xfffff800;
    uStack_7b4 = 0xfffff800;
    local_7d0 = 0x7bff;
    uStack_7cc = 0x7bff;
    uStack_7c8 = 0x7bff;
    uStack_7c4 = 0x7bff;
    local_7e0 = 0x38000000;
    uStack_7dc = 0x38000000;
    uStack_7d8 = 0x38000000;
    uStack_7d4 = 0x38000000;
    local_7f0 = 0x9e;
    uStack_7ec = 0x9e;
    uStack_7e8 = 0x9e;
    uStack_7e4 = 0x9e;
    local_800 = 0x20;
    uStack_7fc = 0x20;
    uStack_7f8 = 0x20;
    uStack_7f4 = 0x20;
    local_810 = 3;
    uStack_80c = 3;
    uStack_808 = 3;
    uStack_804 = 3;
    local_820 = 0xffff;
    uStack_81c = 0xffff;
    uStack_818 = 0xffff;
    uStack_814 = 0xffff;
    local_830 = 0x7ffffc00;
    uStack_82c = 0x7ffffc00;
    uStack_828 = 0x7ffffc00;
    uStack_824 = 0x7ffffc00;
    local_840 = 0x7ff;
    uStack_83c = 0x7ff;
    uStack_838 = 0x7ff;
    uStack_834 = 0x7ff;
    local_850 = 0x1ff;
    uStack_84c = 0x1ff;
    uStack_848 = 0x1ff;
    uStack_844 = 0x1ff;
    local_860 = 0x5ff;
    uStack_85c = 0x5ff;
    uStack_858 = 0x5ff;
    uStack_854 = 0x5ff;
    local_870 = 0xfffffe00;
    uStack_86c = 0xfffffe00;
    uStack_868 = 0xfffffe00;
    uStack_864 = 0xfffffe00;
    for (uVar22 = 0; pbVar3 = local_878, uVar22 < bVar1; uVar22 = uVar22 + 1) {
      unpack_color_endpoints
                ((ctxo->context).config.profile,(uint)local_7a0.color_formats[uVar22],
                 local_7a0.color_formats + uVar22 * 8 + 0xc,local_3c0,&local_891,&local_720,
                 local_710);
      auVar5._4_4_ = uStack_86c;
      auVar5._0_4_ = local_870;
      auVar5._8_4_ = uStack_868;
      auVar5._12_4_ = uStack_864;
      auVar6._4_4_ = uStack_85c;
      auVar6._0_4_ = local_860;
      auVar6._8_4_ = uStack_858;
      auVar6._12_4_ = uStack_854;
      auVar7._4_4_ = uStack_84c;
      auVar7._0_4_ = local_850;
      auVar7._8_4_ = uStack_848;
      auVar7._12_4_ = uStack_844;
      auVar8._4_4_ = uStack_83c;
      auVar8._0_4_ = local_840;
      auVar8._8_4_ = uStack_838;
      auVar8._12_4_ = uStack_834;
      auVar9._4_4_ = uStack_82c;
      auVar9._0_4_ = local_830;
      auVar9._8_4_ = uStack_828;
      auVar9._12_4_ = uStack_824;
      auVar10._4_4_ = uStack_81c;
      auVar10._0_4_ = local_820;
      auVar10._8_4_ = uStack_818;
      auVar10._12_4_ = uStack_814;
      auVar11._4_4_ = uStack_80c;
      auVar11._0_4_ = local_810;
      auVar11._8_4_ = uStack_808;
      auVar11._12_4_ = uStack_804;
      auVar12._4_4_ = uStack_7fc;
      auVar12._0_4_ = local_800;
      auVar12._8_4_ = uStack_7f8;
      auVar12._12_4_ = uStack_7f4;
      auVar13._4_4_ = uStack_7ec;
      auVar13._0_4_ = local_7f0;
      auVar13._8_4_ = uStack_7e8;
      auVar13._12_4_ = uStack_7e4;
      info->color_endpoint_modes[uVar22] = (uint)local_7a0.color_formats[uVar22];
      bVar20 = local_891;
      if (((info->is_hdr_block | local_3c0[0]) & 1U) != 0) {
        bVar20 = true;
      }
      info->is_hdr_block = bVar20;
      uVar17 = -(local_3c0[0] & 1);
      auVar4 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
      auVar4 = vpinsrd_avx(auVar4,uVar17,2);
      auVar4 = vpinsrd_avx(auVar4,-(uint)local_891,3);
      for (lVar19 = 0; lVar19 != 0x20; lVar19 = lVar19 + 0x10) {
        auVar23 = *(undefined1 (*) [16])((long)local_720.m + lVar19);
        auVar24 = vpand_avx(auVar8,auVar23);
        auVar27 = vpcmpgtd_avx(auVar24,auVar6);
        auVar25 = vpslld_avx(auVar24,2);
        auVar25 = vpaddd_avx(auVar5,auVar25);
        auVar15._2_2_ = uStack_7ae;
        auVar15._0_2_ = local_7b0;
        auVar15._4_2_ = uStack_7ac;
        auVar15._6_2_ = uStack_7aa;
        auVar15._8_2_ = uStack_7a8;
        auVar15._10_2_ = uStack_7a6;
        auVar15._12_2_ = uStack_7a4;
        auVar15._14_2_ = uStack_7a2;
        auVar26 = vpmaddwd_avx(auVar24,auVar15);
        auVar14._4_4_ = uStack_7bc;
        auVar14._0_4_ = local_7c0;
        auVar14._8_4_ = uStack_7b8;
        auVar14._12_4_ = uStack_7b4;
        auVar26 = vpaddd_avx(auVar26,auVar14);
        auVar25 = vblendvps_avx(auVar25,auVar26,auVar27);
        auVar26 = vpsrld_avx(auVar23,8);
        auVar26 = vpandn_avx(auVar26,auVar23);
        auVar26 = vcvtdq2ps_avx(auVar26);
        auVar26 = vpsrld_avx(auVar26,0x17);
        auVar26 = vpsubd_avx(auVar13,auVar26);
        auVar26 = vpmaxsd_avx(auVar26,(undefined1  [16])0x0);
        auVar27 = vpminsd_avx(auVar26,auVar12);
        auVar26 = vpcmpgtd_avx(auVar24,auVar7);
        auVar24 = vpmaddwd_avx(auVar11,auVar24);
        auVar25 = vblendvps_avx(auVar24,auVar25,auVar26);
        auVar24 = vpslld_avx(auVar27,0x17);
        auVar26._4_4_ = uStack_7dc;
        auVar26._0_4_ = local_7e0;
        auVar26._8_4_ = uStack_7d8;
        auVar26._12_4_ = uStack_7d4;
        auVar26 = vpaddd_avx(auVar24,auVar26);
        auVar24._0_4_ = (int)auVar26._0_4_;
        auVar24._4_4_ = (int)auVar26._4_4_;
        auVar24._8_4_ = (int)auVar26._8_4_;
        auVar24._12_4_ = (int)auVar26._12_4_;
        auVar26 = vpmulld_avx(auVar24,auVar23);
        auVar29._8_4_ = 0x3ff;
        auVar29._0_8_ = 0x3ff000003ff;
        auVar29._12_4_ = 0x3ff;
        auVar26 = vpsrld_avx(auVar26,6);
        auVar26 = vpand_avx(auVar26,auVar29);
        auVar24 = vpcmpeqd_avx(auVar10,auVar23);
        auVar27 = vpslld_avx(auVar27,10);
        auVar26 = vpsubd_avx(auVar26,auVar27);
        auVar27._8_4_ = 0x7800;
        auVar27._0_8_ = 0x780000007800;
        auVar27._12_4_ = 0x7800;
        auVar26 = vpaddd_avx(auVar26,auVar27);
        auVar28._8_4_ = 0x3c00;
        auVar28._0_8_ = 0x3c0000003c00;
        auVar28._12_4_ = 0x3c00;
        auVar26 = vblendvps_avx(auVar26,auVar28,auVar24);
        auVar24 = vpcmpgtd_avx(auVar23,auVar11);
        auVar27 = vpslld_avx(auVar23,8);
        auVar26 = vblendvps_avx(auVar27,auVar26,auVar24);
        auVar23 = vpsrld_avx(auVar23,1);
        auVar23 = vpand_avx(auVar9,auVar23);
        auVar25 = vpsrld_avx(auVar25,3);
        auVar23 = vpor_avx(auVar25,auVar23);
        auVar25._4_4_ = uStack_7cc;
        auVar25._0_4_ = local_7d0;
        auVar25._8_4_ = uStack_7c8;
        auVar25._12_4_ = uStack_7c4;
        auVar23 = vpminud_avx(auVar23,auVar25);
        auVar23 = vpblendvb_avx(auVar26,auVar23,auVar4);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vcvtph2ps_f16c(auVar23);
        *(undefined1 (*) [16])((long)(*paafVar21)[0] + lVar19) = auVar23;
      }
      paafVar21 = paafVar21 + 1;
      bVar1 = local_7a0.partition_count;
    }
    unpack_weights(local_878,&local_7a0,local_888,(bool)(local_890->field_0x5 & 1),(int *)&local_720
                   ,(int *)local_3c0);
    bVar16 = pbVar3->texel_count;
    for (uVar22 = 0; bVar16 != uVar22; uVar22 = uVar22 + 1) {
      info->weight_values_plane1[uVar22] = (float)*(int *)((long)local_720.m + uVar22 * 4) * 0.0625;
      if (info->is_dual_plane_block == true) {
        info->weight_values_plane2[uVar22] = (float)*(int *)(local_3c0 + uVar22 * 4) * 0.0625;
      }
    }
    for (uVar22 = 0; uVar22 < bVar16; uVar22 = uVar22 + 1) {
      info->partition_assignment[uVar22] = local_880->partition_of_texel[uVar22];
      bVar16 = pbVar3->texel_count;
    }
  }
  return ASTCENC_SUCCESS;
}

Assistant:

astcenc_error astcenc_get_block_info(
	astcenc_context* ctxo,
	const uint8_t data[16],
	astcenc_block_info* info
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	(void)data;
	(void)info;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;

	// Decode the compressed data into a symbolic form
	symbolic_compressed_block scb;
	physical_to_symbolic(*ctx->bsd, data, scb);

	// Fetch the appropriate partition and decimation tables
	block_size_descriptor& bsd = *ctx->bsd;

	// Start from a clean slate
	memset(info, 0, sizeof(*info));

	// Basic info we can always populate
	info->profile = ctx->config.profile;

	info->block_x = ctx->config.block_x;
	info->block_y = ctx->config.block_y;
	info->block_z = ctx->config.block_z;
	info->texel_count = bsd.texel_count;

	// Check for error blocks first
	info->is_error_block = scb.block_type == SYM_BTYPE_ERROR;
	if (info->is_error_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Check for constant color blocks second
	info->is_constant_block = scb.block_type == SYM_BTYPE_CONST_F16 ||
	                          scb.block_type == SYM_BTYPE_CONST_U16;
	if (info->is_constant_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Otherwise handle a full block ; known to be valid after conditions above have been checked
	int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	const block_mode& bm = bsd.get_block_mode(scb.block_mode);
	const decimation_info& di = bsd.get_decimation_info(bm.decimation_mode);

	info->weight_x = di.weight_x;
	info->weight_y = di.weight_y;
	info->weight_z = di.weight_z;

	info->is_dual_plane_block = bm.is_dual_plane != 0;

	info->partition_count = scb.partition_count;
	info->partition_index = scb.partition_index;
	info->dual_plane_component = scb.plane2_component;

	info->color_level_count = get_quant_level(scb.get_color_quant_mode());
	info->weight_level_count = get_quant_level(bm.get_weight_quant_mode());

	// Unpack color endpoints for each active partition
	for (unsigned int i = 0; i < scb.partition_count; i++)
	{
		bool rgb_hdr;
		bool a_hdr;
		vint4 endpnt[2];

		unpack_color_endpoints(ctx->config.profile,
		                       scb.color_formats[i],
		                       scb.color_values[i],
		                       rgb_hdr, a_hdr,
		                       endpnt[0], endpnt[1]);

		// Store the color endpoint mode info
		info->color_endpoint_modes[i] = scb.color_formats[i];
		info->is_hdr_block = info->is_hdr_block || rgb_hdr || a_hdr;

		// Store the unpacked and decoded color endpoint
		vmask4 hdr_mask(rgb_hdr, rgb_hdr, rgb_hdr, a_hdr);
		for (int j = 0; j < 2; j++)
		{
			vint4 color_lns = lns_to_sf16(endpnt[j]);
			vint4 color_unorm = unorm16_to_sf16(endpnt[j]);
			vint4 datai = select(color_unorm, color_lns, hdr_mask);
			store(float16_to_float(datai), info->color_endpoints[i][j]);
		}
	}

	// Unpack weights for each texel
	int weight_plane1[BLOCK_MAX_TEXELS];
	int weight_plane2[BLOCK_MAX_TEXELS];

	unpack_weights(bsd, scb, di, bm.is_dual_plane, weight_plane1, weight_plane2);
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->weight_values_plane1[i] = static_cast<float>(weight_plane1[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		if (info->is_dual_plane_block)
		{
			info->weight_values_plane2[i] = static_cast<float>(weight_plane2[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		}
	}

	// Unpack partition assignments for each texel
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->partition_assignment[i] = pi.partition_of_texel[i];
	}

	return ASTCENC_SUCCESS;
#endif
}